

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_sha512h_arm(void *vd,void *vn,void *vm)

{
  long lVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  uint64_t d1;
  uint64_t d0;
  uint64_t *rm;
  uint64_t *rn;
  uint64_t *rd;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  lVar1 = *vd;
  lVar4 = *(long *)((long)vd + 8);
  uVar2 = S1_512(*(uint64_t *)((long)vm + 8));
  uVar3 = cho512(*(uint64_t *)((long)vm + 8),*vn,*(uint64_t *)((long)vn + 8));
  lVar4 = uVar2 + uVar3 + lVar4;
  uVar2 = S1_512(lVar4 + *vm);
  uVar3 = cho512(lVar4 + *vm,*(uint64_t *)((long)vm + 8),*vn);
  *(uint64_t *)vd = uVar2 + uVar3 + lVar1;
  *(long *)((long)vd + 8) = lVar4;
  return;
}

Assistant:

void HELPER(crypto_sha512h)(void *vd, void *vn, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    uint64_t d0 = rd[0];
    uint64_t d1 = rd[1];

    d1 += S1_512(rm[1]) + cho512(rm[1], rn[0], rn[1]);
    d0 += S1_512(d1 + rm[0]) + cho512(d1 + rm[0], rm[1], rn[0]);

    rd[0] = d0;
    rd[1] = d1;
}